

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O3

IOTHUBMESSAGE_DISPOSITION_RESULT c2d_msg_callback(IOTHUB_MESSAGE_HANDLE event_msg,void *user_ctx)

{
  LOGGER_LOG p_Var1;
  
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    (*p_Var1)(AZ_LOG_INFO,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"c2d_msg_callback",0x80,1,"c2d_msg_callback invoked, message=<%p>, user_ctx=<%p>",
              event_msg,user_ctx);
  }
  IoTHubMessage_GetMessageId(event_msg);
  IoTHubMessage_GetCorrelationId(event_msg);
  IoTHubMessage_GetContentTypeSystemProperty(event_msg);
  IoTHubMessage_GetContentEncodingSystemProperty(event_msg);
  IoTHubMessage_GetOutputName(event_msg);
  IoTHubMessage_GetInputName(event_msg);
  IoTHubMessage_GetProperty(event_msg,"property_key");
  return IOTHUBMESSAGE_ACCEPTED;
}

Assistant:

static IOTHUBMESSAGE_DISPOSITION_RESULT c2d_msg_callback(IOTHUB_MESSAGE_HANDLE event_msg, void* user_ctx)
{
    LogInfo("c2d_msg_callback invoked, message=<%p>, user_ctx=<%p>", event_msg, user_ctx);

    // Test the properties from the message
    const char* test_value;
    test_value = IoTHubMessage_GetMessageId(event_msg);
    test_value = IoTHubMessage_GetCorrelationId(event_msg);
    test_value = IoTHubMessage_GetContentTypeSystemProperty(event_msg);
    test_value = IoTHubMessage_GetContentEncodingSystemProperty(event_msg);
    test_value = IoTHubMessage_GetOutputName(event_msg);
    test_value = IoTHubMessage_GetInputName(event_msg);
    test_value = IoTHubMessage_GetProperty(event_msg, "property_key");

    return IOTHUBMESSAGE_ACCEPTED;
}